

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

bool ImgfsFile::isimgfsheader(ReadWriter_ptr *rd,uint64_t ofs)

{
  bool bVar1;
  element_type *peVar2;
  reference pvVar3;
  size_type sVar4;
  allocator<unsigned_char> local_41;
  undefined1 local_40 [8];
  ByteVector sig;
  uint8_t imgfsuuid [16];
  uint64_t ofs_local;
  ReadWriter_ptr *rd_local;
  
  sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4d2bd4e39d2cacf8;
  imgfsuuid[0] = 0xbd;
  imgfsuuid[1] = '0';
  imgfsuuid[2] = 0x91;
  imgfsuuid[3] = 'n';
  imgfsuuid[4] = 0xd8;
  imgfsuuid[5] = 'O';
  imgfsuuid[6] = '1';
  imgfsuuid[7] = 0xdc;
  imgfsuuid._8_8_ = ofs;
  peVar2 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      rd);
  (*peVar2->_vptr_ReadWriter[4])(peVar2,imgfsuuid._8_8_);
  std::allocator<unsigned_char>::allocator(&local_41);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0x10,&local_41);
  std::allocator<unsigned_char>::~allocator(&local_41);
  peVar2 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      rd);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  (*peVar2->_vptr_ReadWriter[2])(peVar2,pvVar3,sVar4);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
  bVar1 = std::equal<unsigned_char_const*,unsigned_char*>
                    ((uchar *)&sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,imgfsuuid + 8,
                     pvVar3);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return bVar1;
}

Assistant:

static bool isimgfsheader(ReadWriter_ptr rd, uint64_t ofs)
    {
        const uint8_t imgfsuuid[16]= {
            0xf8, 0xac, 0x2c, 0x9d, 0xe3, 0xd4, 0x2b, 0x4d, 0xbd, 0x30, 0x91, 0x6e, 0xd8, 0x4f, 0x31, 0xdc
        };
        rd->setpos(ofs);
        ByteVector sig(16);
        rd->read(&sig[0], sig.size());

        return std::equal(imgfsuuid, imgfsuuid+sizeof(imgfsuuid), &sig[0]);
    }